

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::openWebSocket
          (NetworkAddressHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  HttpInputStream HVar3;
  void *pvVar4;
  TransformPromiseNodeBase *this_00;
  StringPtr url_00;
  Promise<kj::HttpClient::WebSocketResponse> result;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
  refcounted;
  undefined1 local_48 [16];
  HttpInputStream local_38;
  
  url_00.content.size_ = url.content.size_;
  getClient((NetworkAddressHttpClient *)(local_48 + 8));
  HVar3._vptr_HttpInputStream = local_38._vptr_HttpInputStream;
  url_00.content.ptr = (char *)local_38._vptr_HttpInputStream[4];
  HttpClientImpl::openWebSocket((HttpClientImpl *)local_48,url_00,headers);
  uVar2 = local_48._0_8_;
  local_38._vptr_HttpInputStream = (_func_int **)0x0;
  pPVar1 = *(PromiseArena **)(local_48._0_8_ + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_48._0_8_ - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_48,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5989:9)>
               ::anon_class_16_1_81fbabb9_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d0) = &PTR_destroy_0061b8b0;
    *(undefined8 *)((long)pvVar4 + 0x3f0) = local_48._8_8_;
    *(_func_int ***)((long)pvVar4 + 0x3f8) = HVar3._vptr_HttpInputStream;
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    *(PromiseArena **)(local_48._0_8_ + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_48._0_8_ + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)local_48,
               kj::_::
               SimpleTransformPromiseNode<kj::HttpClient::WebSocketResponse,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:5989:9)>
               ::anon_class_16_1_81fbabb9_for_func::operator());
    ((PromiseArenaMember *)(uVar2 + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0061b8b0;
    ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)local_48._8_8_
    ;
    *(_func_int ***)(uVar2 + -8) = HVar3._vptr_HttpInputStream;
    *(PromiseArena **)(uVar2 + -0x28) = pPVar1;
  }
  uVar2 = local_48._0_8_;
  (this->super_HttpClient)._vptr_HttpClient = (_func_int **)this_00;
  if ((PromiseArenaMember *)local_48._0_8_ != (PromiseArenaMember *)0x0) {
    local_48._0_8_ = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    auto refcounted = getClient();
    auto result = refcounted->client->openWebSocket(url, headers);
    return result.then(
        [refcounted=kj::mv(refcounted)](WebSocketResponse&& response) mutable {
      KJ_SWITCH_ONEOF(response.webSocketOrBody) {
        KJ_CASE_ONEOF(body, kj::Own<kj::AsyncInputStream>) {
          response.webSocketOrBody = body.attach(kj::mv(refcounted));
        }
        KJ_CASE_ONEOF(ws, kj::Own<WebSocket>) {
          // The only reason we need to attach the client to the WebSocket is because otherwise
          // the response headers will be deleted prematurely. Otherwise, the WebSocket has taken
          // ownership of the connection.
          //
          // TODO(perf): Maybe we could transfer ownership of the response headers specifically?
          response.webSocketOrBody = ws.attach(kj::mv(refcounted));
        }
      }
      return kj::mv(response);
    });
  }